

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86ADD(uchar *stream,x86Reg dst,int num)

{
  uchar *puVar1;
  int iVar2;
  
  if (8 < (int)dst) {
    *stream = 8 < (int)dst | 0x40;
  }
  puVar1 = stream + (8 < (int)dst);
  if ((char)(uchar)num == num) {
    *puVar1 = 0x83;
    puVar1[1] = regCode[dst] | 0xc0;
    puVar1[2] = (uchar)num;
    iVar2 = 3;
  }
  else {
    *puVar1 = 0x81;
    puVar1[1] = regCode[dst] | 0xc0;
    *(int *)(puVar1 + 2) = num;
    iVar2 = 6;
  }
  return ((int)puVar1 + iVar2) - (int)stream;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}